

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  void *in_stack_00000020;
  int in_stack_0000002c;
  kmp_flag_64 *in_stack_00000030;
  kmp_info_t *in_stack_00000038;
  
  __kmp_wait_template<kmp_flag_64>
            (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  return extraout_EAX;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    __kmp_wait_template(this_thr, this,
                        final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }